

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue_TEST.cpp
# Opt level: O0

void __thiscall
Valid_test_case_Queue_Queue_unit_test_Test::~Valid_test_case_Queue_Queue_unit_test_Test
          (Valid_test_case_Queue_Queue_unit_test_Test *this)

{
  Valid_test_case_Queue_Queue_unit_test_Test *this_local;
  
  ~Valid_test_case_Queue_Queue_unit_test_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Valid_test_case_Queue, Queue_unit_test){
    QUEUE<int> q;

    q.push(1);
    q.push(2);
    q.push(3);
    q.push(4);

    ASSERT_EQ(1, q.front());
    q.pop();
    ASSERT_EQ(2, q.front());
    q.pop();
    ASSERT_EQ(3, q.front());
    q.pop();
    ASSERT_EQ(4, q.front());
    q.pop();
}